

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_parser_parser.cpp
# Opt level: O1

PGList * duckdb_libpgquery::raw_parser(char *str)

{
  int iVar1;
  core_yyscan_t yyscanner;
  base_yy_extra_type yyextra;
  base_yy_extra_type local_90;
  
  yyscanner = scanner_init(str,&local_90.core_yy_extra,(PGScanKeyword *)&ScanKeywords,0x1e3);
  local_90.have_lookahead = false;
  parser_init(&local_90);
  iVar1 = base_yyparse(yyscanner);
  scanner_finish(yyscanner);
  if (iVar1 != 0) {
    local_90.parsetree = (PGList *)0x0;
  }
  return local_90.parsetree;
}

Assistant:

PGList *raw_parser(const char *str) {
	core_yyscan_t yyscanner;
	base_yy_extra_type yyextra;
	int yyresult;

	/* initialize the flex scanner */
	yyscanner = scanner_init(str, &yyextra.core_yy_extra, ScanKeywords, NumScanKeywords);

	/* base_yylex() only needs this much initialization */
	yyextra.have_lookahead = false;

	/* initialize the bison parser */
	parser_init(&yyextra);

	/* Parse! */
	yyresult = base_yyparse(yyscanner);

	/* Clean up (release memory) */
	scanner_finish(yyscanner);

	if (yyresult) /* error */
		return NIL;

	return yyextra.parsetree;
}